

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_info.cpp
# Opt level: O1

void __thiscall duckdb::AlterInfo::AlterInfo(AlterInfo *this,AlterType type)

{
  (this->super_ParseInfo).info_type = ALTER_INFO;
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)&PTR__AlterTableInfo_0247d2a8;
  (this->super_ParseInfo).field_0x9 = type;
  (this->catalog)._M_dataplus._M_p = (pointer)&(this->catalog).field_2;
  (this->catalog)._M_string_length = 0;
  (this->catalog).field_2._M_local_buf[0] = '\0';
  (this->schema)._M_dataplus._M_p = (pointer)&(this->schema).field_2;
  (this->schema)._M_string_length = 0;
  (this->schema).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

AlterInfo::AlterInfo(AlterType type) : ParseInfo(TYPE), type(type) {
}